

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int find_qindex_by_rate(AV1_COMP *cpi,int desired_bits_per_mb,FRAME_TYPE frame_type,int best_qindex,
                       int worst_qindex)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_ESI;
  int in_R8D;
  int mid_bits_per_mb;
  int mid;
  int high;
  int low;
  int in_stack_00000028;
  FRAME_TYPE in_stack_0000002f;
  AV1_COMP *in_stack_00000030;
  int local_20;
  int local_1c;
  
  iVar1 = in_R8D;
  local_1c = in_ECX;
  while (local_20 = iVar1, local_1c < local_20) {
    iVar1 = local_1c + local_20 >> 1;
    iVar2 = av1_rc_bits_per_mb(in_stack_00000030,in_stack_0000002f,in_stack_00000028,(double)cpi,
                               desired_bits_per_mb);
    if (in_ESI < iVar2) {
      local_1c = iVar1 + 1;
      iVar1 = local_20;
    }
  }
  return local_1c;
}

Assistant:

static int find_qindex_by_rate(const AV1_COMP *const cpi,
                               int desired_bits_per_mb, FRAME_TYPE frame_type,
                               int best_qindex, int worst_qindex) {
  assert(best_qindex <= worst_qindex);
  int low = best_qindex;
  int high = worst_qindex;
  while (low < high) {
    const int mid = (low + high) >> 1;
    const int mid_bits_per_mb =
        av1_rc_bits_per_mb(cpi, frame_type, mid, 1.0, 0);
    if (mid_bits_per_mb > desired_bits_per_mb) {
      low = mid + 1;
    } else {
      high = mid;
    }
  }
  assert(low == high);
  assert(av1_rc_bits_per_mb(cpi, frame_type, low, 1.0, 0) <=
             desired_bits_per_mb ||
         low == worst_qindex);
  return low;
}